

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::GeneratorsForTest::~GeneratorsForTest(GeneratorsForTest *this)

{
  GeneratorsForTest *this_local;
  
  (this->super_IGeneratorsForTest)._vptr_IGeneratorsForTest =
       (_func_int **)&PTR__GeneratorsForTest_0022e2e0;
  deleteAll<std::vector<Catch::IGeneratorInfo*,std::allocator<Catch::IGeneratorInfo*>>>
            (&this->m_generatorsInOrder);
  std::vector<Catch::IGeneratorInfo_*,_std::allocator<Catch::IGeneratorInfo_*>_>::~vector
            (&this->m_generatorsInOrder);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::IGeneratorInfo_*>_>_>
  ::~map(&this->m_generatorsByName);
  IGeneratorsForTest::~IGeneratorsForTest(&this->super_IGeneratorsForTest);
  return;
}

Assistant:

~GeneratorsForTest() {
			deleteAll(m_generatorsInOrder);
		}